

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

Vec_Str_t *
Bmc_CollapseOneOld(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  char cVar1;
  uint *puVar2;
  Vec_Int_t *pVVar3;
  size_t sVar4;
  sat_solver *psVar5;
  int iVar6;
  Cnf_Dat_t *p_00;
  sat_solver *psVar7;
  void *pvVar8;
  undefined8 *puVar9;
  void *pvVar10;
  Vec_Int_t *pVVar11;
  int *piVar12;
  ulong uVar13;
  bool bVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar16;
  uint uVar17;
  uint uVar18;
  uint **ppuVar19;
  uint uVar20;
  sat_solver **ppsVar21;
  ulong uVar22;
  int i;
  uint uVar23;
  char *pcVar24;
  long *plVar25;
  int iVar26;
  long lVar27;
  sat_solver **ppsVar28;
  int iLit;
  int fComplete [2];
  timespec ts;
  sat_solver *pSatClean [2];
  uint local_14c;
  Vec_Int_t *local_148;
  int local_140;
  uint local_13c;
  Vec_Int_t *local_138;
  ulong local_130;
  sat_solver **local_128;
  uint local_11c;
  sat_solver *local_118 [3];
  long local_100;
  Vec_Int_t *local_f8;
  int local_f0 [2];
  long local_e8;
  sat_solver **local_e0;
  timespec local_d8;
  int local_c4;
  int local_c0;
  int local_bc;
  uint *local_b8 [2];
  sat_solver *local_a8;
  sat_solver *local_a0;
  long local_98 [2];
  Vec_Int_t *local_88;
  ulong local_80;
  uint *local_78;
  sat_solver *local_70;
  sat_solver *local_68 [2];
  long local_58;
  Cnf_Dat_t *local_50;
  long *local_48;
  long local_40;
  long local_38;
  sat_solver **ppsVar15;
  
  uVar17 = p->vCis->nSize;
  pvVar10 = (void *)0x0;
  local_140 = fVerbose;
  local_11c = nCubeLim;
  local_c4 = nBTLimit;
  local_c0 = fCanon;
  local_bc = fReverse;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  local_a8 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  local_70 = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  local_68[0] = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  local_50 = p_00;
  local_68[1] = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  psVar7 = (sat_solver *)malloc(0x10);
  psVar7->size = 1000;
  psVar7->cap = 0;
  pvVar8 = malloc(1000);
  *(void **)&psVar7->qhead = pvVar8;
  local_118[0] = psVar7;
  puVar9 = (undefined8 *)malloc(0x10);
  *puVar9 = 1000;
  pvVar8 = malloc(1000);
  puVar9[1] = pvVar8;
  local_118[1] = (sat_solver *)puVar9;
  local_b8[0] = (uint *)malloc(0x10);
  uVar18 = 0x10;
  if (0xe < uVar17 - 1) {
    uVar18 = uVar17;
  }
  local_b8[0][1] = 0;
  *local_b8[0] = uVar18;
  lVar27 = (long)(int)uVar18;
  local_130 = (ulong)uVar17;
  if (uVar18 != 0) {
    pvVar10 = malloc(lVar27 * 4);
  }
  *(void **)(local_b8[0] + 2) = pvVar10;
  local_78 = (uint *)malloc(0x10);
  local_78[1] = 0;
  *local_78 = uVar18;
  if (uVar18 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc(lVar27 * 4);
  }
  uVar22 = local_130;
  *(void **)(local_78 + 2) = pvVar8;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  pVVar11->nSize = 0;
  pVVar11->nCap = uVar18;
  if (uVar18 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc(lVar27 * 4);
  }
  pVVar11->pArray = piVar12;
  local_148 = (Vec_Int_t *)malloc(0x10);
  local_148->nSize = 0;
  local_148->nCap = uVar18;
  if (uVar18 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc(lVar27 * 4);
  }
  local_148->pArray = piVar12;
  local_88 = (Vec_Int_t *)malloc(0x10);
  local_88->nSize = 0;
  local_88->nCap = uVar18;
  if (uVar18 == 0) {
    piVar12 = (int *)0x0;
  }
  else {
    piVar12 = (int *)malloc(lVar27 * 4);
  }
  local_88->pArray = piVar12;
  local_f8 = (Vec_Int_t *)malloc(0x10);
  local_f8->nSize = 0;
  local_f8->nCap = uVar18;
  if (uVar18 == 0) {
    piVar12 = (int *)0x0;
    uVar16 = extraout_RDX;
  }
  else {
    piVar12 = (int *)malloc(lVar27 << 2);
    uVar16 = extraout_RDX_00;
  }
  local_f8->pArray = piVar12;
  local_98[0] = 0;
  local_e8 = 0;
  local_58 = 0;
  local_38 = 0;
  local_f0[0] = 0;
  local_f0[1] = 0;
  iVar26 = local_50->nVars;
  iVar6 = (int)uVar22;
  if (local_bc == 0) {
    if (0 < iVar6) {
      iVar6 = -iVar6;
      do {
        Vec_IntPush(pVVar11,iVar26 + iVar6);
        iVar6 = iVar6 + 1;
        uVar16 = extraout_RDX_02;
      } while (iVar6 != 0);
    }
  }
  else if (0 < iVar6) {
    uVar17 = iVar6 + 1;
    do {
      iVar26 = iVar26 + -1;
      Vec_IntPush(pVVar11,iVar26);
      uVar17 = uVar17 - 1;
      uVar16 = extraout_RDX_01;
    } while (1 < uVar17);
  }
  local_40 = (long)local_c4;
  uVar17 = 2;
  ppsVar15 = &local_a8;
  ppsVar28 = local_68;
  ppsVar21 = local_118;
  ppuVar19 = local_b8;
  uVar16 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
  pcVar24 = " 0\n";
  local_138 = pVVar11;
LAB_0058da77:
  pVVar11 = local_138;
  local_e0 = ppsVar21;
  local_a0 = (sat_solver *)CONCAT44(local_a0._4_4_,(int)uVar16);
  psVar7 = *ppsVar15;
  local_14c = uVar17;
  local_128 = ppsVar28;
  iVar26 = sat_solver_solve(psVar7,(lit *)&local_14c,(lit *)&local_148,local_40,0,0,0);
  psVar5 = local_118[0];
  uVar17 = (uint)local_130;
  if (iVar26 == -1) {
    local_118[0]->cap = 0;
    iVar26 = 0;
    lVar27 = 0;
    while( true ) {
      cVar1 = pcVar24[lVar27];
      if (iVar26 == psVar5->size) {
        if (iVar26 < 0x10) {
          if (*(void **)&psVar5->qhead == (void *)0x0) {
            pvVar8 = malloc(0x10);
          }
          else {
            pvVar8 = realloc(*(void **)&psVar5->qhead,0x10);
          }
          *(void **)&psVar5->qhead = pvVar8;
          psVar5->size = 0x10;
        }
        else {
          uVar18 = iVar26 * 2;
          if (*(void **)&psVar5->qhead == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar18);
          }
          else {
            pvVar8 = realloc(*(void **)&psVar5->qhead,(ulong)uVar18);
          }
          *(void **)&psVar5->qhead = pvVar8;
          psVar5->size = uVar18;
        }
      }
      else {
        pvVar8 = *(void **)&psVar5->qhead;
      }
      psVar7 = local_118[0];
      pVVar11 = local_138;
      iVar26 = psVar5->cap;
      psVar5->cap = iVar26 + 1;
      *(char *)((long)pvVar8 + (long)iVar26) = cVar1;
      if (lVar27 == 2) break;
      iVar26 = psVar5->cap;
      lVar27 = lVar27 + 1;
    }
    uVar18 = local_118[0]->cap;
    if (uVar18 == local_118[0]->size) {
      if ((int)uVar18 < 0x10) {
        if (*(void **)&local_118[0]->qhead == (void *)0x0) {
          pvVar8 = malloc(0x10);
        }
        else {
          pvVar8 = realloc(*(void **)&local_118[0]->qhead,0x10);
        }
        *(void **)&psVar7->qhead = pvVar8;
        psVar7->size = 0x10;
      }
      else {
        sVar4 = (ulong)uVar18 * 2;
        if (*(void **)&local_118[0]->qhead == (void *)0x0) {
          pvVar8 = malloc(sVar4);
        }
        else {
          pvVar8 = realloc(*(void **)&local_118[0]->qhead,sVar4);
        }
        *(void **)&psVar7->qhead = pvVar8;
        psVar7->size = (int)sVar4;
      }
    }
    else {
      pvVar8 = *(void **)&local_118[0]->qhead;
    }
    iVar26 = psVar7->cap;
    psVar7->cap = iVar26 + 1;
    *(undefined1 *)((long)pvVar8 + (long)iVar26) = 0;
    local_f0[0] = 1;
    uVar18 = 0;
  }
  else {
    if (iVar26 != 0) goto code_r0x0058dace;
    uVar18 = 0;
  }
  goto LAB_0058e37e;
code_r0x0058dace:
  iVar26 = pVVar11->nSize;
  if (0 < (long)iVar26) {
    piVar12 = local_138->pArray;
    lVar27 = 0;
    do {
      if (piVar12[lVar27] < 0) {
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      Vec_IntPush((Vec_Int_t *)*ppuVar19,piVar12[lVar27] * 2 + 1);
      lVar27 = lVar27 + 1;
    } while (iVar26 != lVar27);
  }
  iVar26 = sat_solver_addclause(psVar7,(lit *)&local_14c,(lit *)&local_148);
  if (iVar26 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x38e,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
  }
  iVar26 = sat_solver_addclause(*local_128,(lit *)&local_14c,(lit *)&local_148);
  if (iVar26 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x390,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
  }
  psVar7 = *local_e0;
  uVar17 = psVar7->cap;
  if (uVar17 == psVar7->size) {
    if ((int)uVar17 < 0x10) {
      if (*(void **)&psVar7->qhead == (void *)0x0) {
        pvVar8 = malloc(0x10);
      }
      else {
        pvVar8 = realloc(*(void **)&psVar7->qhead,0x10);
      }
      *(void **)&psVar7->qhead = pvVar8;
      psVar7->size = 0x10;
    }
    else {
      sVar4 = (ulong)uVar17 * 2;
      if (*(void **)&psVar7->qhead == (void *)0x0) {
        pvVar8 = malloc(sVar4);
      }
      else {
        pvVar8 = realloc(*(void **)&psVar7->qhead,sVar4);
      }
      *(void **)&psVar7->qhead = pvVar8;
      psVar7->size = (int)sVar4;
    }
  }
  else {
    pvVar8 = *(void **)&psVar7->qhead;
  }
  iVar26 = psVar7->cap;
  psVar7->cap = iVar26 + 1;
  *(undefined1 *)((long)pvVar8 + (long)iVar26) = 0;
  uVar17 = 3;
  pcVar24 = " 1\n";
  ppuVar19 = &local_78;
  ppsVar21 = local_118 + 1;
  ppsVar28 = local_68 + 1;
  ppsVar15 = &local_70;
  uVar16 = 0;
  if (((ulong)local_a0 & 1) == 0) goto code_r0x0058dc08;
  goto LAB_0058da77;
code_r0x0058dc08:
  uVar17 = (uint)local_130;
  pVVar11 = local_138;
  uVar18 = 0;
  if (-1 < (int)local_11c) {
    local_100 = 0;
    uVar18 = 0;
    uVar22 = local_130;
    do {
      local_128 = local_118;
      ppsVar21 = &local_a8;
      plVar25 = local_98;
      ppuVar19 = local_b8;
      local_e0 = (sat_solver **)
                 CONCAT44(local_e0._4_4_,(int)CONCAT71((int7)((ulong)ppsVar15 >> 8),1));
      local_48 = &local_e8;
      local_80 = 0;
      local_13c = uVar18;
      do {
        uVar17 = (uint)uVar22;
        if (local_140 != 0) {
          iVar26 = clock_gettime(3,&local_d8);
          if (iVar26 < 0) {
            local_100 = -1;
          }
          else {
            local_100 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
        }
        psVar7 = *ppsVar21;
        local_a0 = psVar7;
        if (local_c0 == 0) {
          iVar26 = pVVar11->nSize;
          if (0 < (long)iVar26) {
            piVar12 = pVVar11->pArray;
            lVar27 = 0;
            do {
              psVar7->polarity[piVar12[lVar27]] = '\0';
              lVar27 = lVar27 + 1;
            } while (iVar26 != lVar27);
          }
          iVar26 = sat_solver_solve(psVar7,(lit *)0x0,(lit *)0x0,0,0,0,0);
        }
        else {
          puVar2 = *ppuVar19;
          sat_solver_set_resource_limits(psVar7,local_40,0,0,0);
          iVar26 = sat_solver_solve_lexsat(psVar7,*(int **)(puVar2 + 2),puVar2[1]);
        }
        if (local_140 != 0) {
          iVar6 = clock_gettime(3,&local_d8);
          if (iVar6 < 0) {
            lVar27 = -1;
          }
          else {
            lVar27 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
          *plVar25 = *plVar25 + (lVar27 - local_100);
        }
        psVar7 = local_a0;
        if (iVar26 == -1) {
LAB_0058e1ee:
          local_f0[local_80] = 1;
          break;
        }
        uVar18 = local_13c;
        if (iVar26 == 0) goto LAB_0058e37e;
        local_148->nSize = 0;
        pVVar3 = (Vec_Int_t *)*ppuVar19;
        pVVar3->nSize = 0;
        iVar26 = pVVar11->nSize;
        if (0 < (long)iVar26) {
          piVar12 = pVVar11->pArray;
          lVar27 = 0;
          do {
            iVar6 = piVar12[lVar27];
            if (((long)iVar6 < 0) || (psVar7->size <= iVar6)) {
              __assert_fail("v >= 0 && v < s->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                            ,0xda,"int sat_solver_var_value(sat_solver *, int)");
            }
            local_14c = (uint)(psVar7->model[iVar6] != 1) + iVar6 * 2;
            Vec_IntPush(local_148,local_14c);
            Vec_IntPush(pVVar3,local_14c);
            lVar27 = lVar27 + 1;
          } while (iVar26 != lVar27);
        }
        pVVar3 = local_88;
        uVar22 = local_130;
        uVar18 = local_13c;
        uVar17 = (uint)local_130;
        if (local_140 != 0) {
          iVar26 = clock_gettime(3,&local_d8);
          if (iVar26 < 0) {
            local_100 = -1;
          }
          else {
            local_100 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
        }
        iVar26 = Bmc_CollapseExpand(local_68[local_80 ^ 1],psVar7,local_148,pVVar3,local_f8,local_c4
                                    ,local_c0,-1);
        if (local_140 != 0) {
          iVar6 = clock_gettime(3,&local_d8);
          if (iVar6 < 0) {
            lVar27 = -1;
          }
          else {
            lVar27 = local_d8.tv_nsec / 1000 + local_d8.tv_sec * 1000000;
          }
          *local_48 = *local_48 + (lVar27 - local_100);
        }
        if (iVar26 < 0) goto LAB_0058e37e;
        psVar7 = *local_128;
        iVar26 = psVar7->cap;
        if (iVar26 < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x249,"char Vec_StrPop(Vec_Str_t *)");
        }
        pvVar8 = *(void **)&psVar7->qhead;
        uVar18 = iVar26 - 1;
        psVar7->cap = uVar18;
        uVar23 = iVar26 + uVar17 + 3;
        local_128 = (sat_solver **)CONCAT44(local_128._4_4_,uVar18);
        if (iVar26 <= (int)uVar23) {
          uVar20 = psVar7->size * 2;
          if ((int)uVar20 < (int)uVar23) {
            uVar20 = uVar23;
            if (pvVar8 == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar23);
            }
            else {
              pvVar8 = realloc(pvVar8,(ulong)uVar23);
            }
LAB_0058dfd6:
            *(void **)&psVar7->qhead = pvVar8;
            psVar7->size = uVar20;
            uVar18 = psVar7->cap;
          }
          else if (psVar7->size < (int)uVar23) {
            if (pvVar8 == (void *)0x0) {
              pvVar8 = malloc((ulong)uVar20);
            }
            else {
              pvVar8 = realloc(pvVar8,(ulong)uVar20);
            }
            goto LAB_0058dfd6;
          }
          if ((int)uVar18 < (int)uVar23) {
            uVar13 = (ulong)(int)uVar18;
            do {
              *(undefined1 *)(*(long *)&psVar7->qhead + uVar13) = 0x2d;
              uVar13 = uVar13 + 1;
            } while (uVar23 != uVar13);
          }
          psVar7->cap = uVar23;
          uVar18 = uVar23;
        }
        uVar23 = (iVar26 + uVar17) - 1;
        if (((int)uVar23 < 0) || ((int)uVar18 <= (int)uVar23)) {
LAB_0058e6db:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                        ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
        }
        uVar13 = (ulong)uVar23;
        *(undefined1 *)(*(long *)&psVar7->qhead + uVar13) = 0x20;
        if (psVar7->cap <= (int)(iVar26 + uVar17)) goto LAB_0058e6db;
        *(byte *)(*(long *)&psVar7->qhead + (ulong)(iVar26 + uVar17)) = (byte)local_e0 & 1 | 0x30;
        if (psVar7->cap <= (int)(uVar13 + 2)) goto LAB_0058e6db;
        *(undefined1 *)(*(long *)&psVar7->qhead + uVar13 + 2) = 10;
        if (psVar7->cap <= (int)(uVar13 + 3)) goto LAB_0058e6db;
        *(undefined1 *)(*(long *)&psVar7->qhead + uVar13 + 3) = 0;
        local_f8->nSize = 0;
        iVar26 = pVVar3->nSize;
        if ((long)iVar26 < 1) {
          lVar27 = 0;
        }
        else {
          piVar12 = pVVar3->pArray;
          lVar27 = 0;
          do {
            uVar17 = piVar12[lVar27];
            if (((long)(int)uVar17 < 0) || (local_148->nSize <= (int)uVar17)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            local_14c = local_148->pArray[(int)uVar17];
            if ((int)local_14c < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x131,"int Abc_LitNot(int)");
            }
            Vec_IntPush(local_f8,local_14c ^ 1);
            if (local_bc == 0) {
              if ((int)local_14c < 0) goto LAB_0058e6fa;
              uVar17 = uVar17 + (int)local_128;
            }
            else {
              if ((int)local_14c < 0) {
LAB_0058e6fa:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x130,"int Abc_LitIsCompl(int)");
              }
              uVar17 = ~uVar17 + uVar23;
              if ((int)uVar17 < 0) goto LAB_0058e6db;
            }
            if (psVar7->cap <= (int)uVar17) goto LAB_0058e6db;
            *(byte *)(*(long *)&psVar7->qhead + (ulong)uVar17) = (byte)local_14c & 1 ^ 0x31;
            lVar27 = lVar27 + 1;
          } while (iVar26 != lVar27);
          lVar27 = (long)local_f8->nSize;
          uVar22 = local_130;
        }
        iVar26 = sat_solver_addclause(local_a0,local_f8->pArray,local_f8->pArray + lVar27);
        pVVar11 = local_138;
        if (iVar26 != 1) {
          if (iVar26 != 0) {
            __assert_fail("status == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                          ,0x3d3,
                          "Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
          }
          goto LAB_0058e1ee;
        }
        local_80 = 1;
        plVar25 = &local_58;
        local_48 = &local_38;
        ppuVar19 = &local_78;
        local_128 = local_118 + 1;
        ppsVar21 = &local_70;
        uVar13 = (ulong)local_e0 & 1;
        local_e0 = (sat_solver **)((ulong)local_e0 & 0xffffffff00000000);
      } while (uVar13 != 0);
      uVar17 = (uint)uVar22;
      uVar18 = local_13c;
      if (local_f0[1] != 0 || local_f0[0] != 0) break;
      uVar18 = local_13c + 1;
      bVar14 = (int)uVar18 < (int)local_11c || local_11c == 0;
      ppsVar15 = (sat_solver **)(ulong)CONCAT31((int3)(local_11c >> 8),bVar14);
    } while (bVar14);
  }
LAB_0058e37e:
  if (pVVar11->pArray != (int *)0x0) {
    free(pVVar11->pArray);
  }
  free(pVVar11);
  if (local_148->pArray != (int *)0x0) {
    free(local_148->pArray);
  }
  free(local_148);
  puVar2 = local_b8[0];
  if (*(void **)(local_b8[0] + 2) != (void *)0x0) {
    free(*(void **)(local_b8[0] + 2));
  }
  free(puVar2);
  puVar2 = local_78;
  if (*(void **)(local_78 + 2) != (void *)0x0) {
    free(*(void **)(local_78 + 2));
  }
  free(puVar2);
  pVVar11 = local_88;
  if (local_88->pArray != (int *)0x0) {
    free(local_88->pArray);
  }
  free(pVVar11);
  if (local_f8->pArray != (int *)0x0) {
    free(local_f8->pArray);
  }
  free(local_f8);
  Cnf_DataFree(local_50);
  sat_solver_delete(local_a8);
  sat_solver_delete(local_70);
  sat_solver_delete(local_68[0]);
  sat_solver_delete(local_68[1]);
  if (local_f0[1] != 0 && local_f0[0] != 0) {
    __assert_fail("!fComplete[0] || !fComplete[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x3e4,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
  }
  if (local_f0[0] == 0 && local_f0[1] == 0) {
    if (local_140 == 0) {
      psVar7 = (sat_solver *)0x0;
      goto LAB_0058e629;
    }
    printf("Processed output with %d supp vars. ",(ulong)uVar17);
LAB_0058e516:
    pcVar24 = "The resulting SOP exceeded %d cubes.\n";
    psVar7 = (sat_solver *)0x0;
    uVar22 = (ulong)local_11c;
  }
  else {
    psVar7 = local_118[local_f0[1]];
    local_118[local_f0[1]] = (sat_solver *)0x0;
    if (1 < uVar18) {
      Bmc_CollapseIrredundantFull((Vec_Str_t *)psVar7,psVar7->cap / (int)(uVar17 + 3),uVar17);
    }
    if (local_140 == 0) goto LAB_0058e629;
    printf("Processed output with %d supp vars. ",(ulong)uVar17);
    if (psVar7 == (sat_solver *)0x0) goto LAB_0058e516;
    pcVar24 = "The best cover contains %d cubes.\n";
    uVar22 = (long)psVar7->cap / (long)(int)(uVar17 + 3) & 0xffffffff;
  }
  printf(pcVar24,uVar22);
  local_148 = (Vec_Int_t *)(double)local_98[0];
  iVar26 = (int)pcVar24;
  Abc_Print(iVar26,"%s =","Onset  minterm");
  Abc_Print(iVar26,"%9.2f sec\n",(double)local_148 / 1000000.0);
  local_148 = (Vec_Int_t *)(double)local_e8;
  Abc_Print(iVar26,"%s =","Onset  expand ");
  Abc_Print(iVar26,"%9.2f sec\n",(double)local_148 / 1000000.0);
  local_148 = (Vec_Int_t *)(double)local_58;
  Abc_Print(iVar26,"%s =","Offset minterm");
  Abc_Print(iVar26,"%9.2f sec\n",(double)local_148 / 1000000.0);
  local_148 = (Vec_Int_t *)(double)local_38;
  Abc_Print(iVar26,"%s =","Offset expand ");
  Abc_Print(iVar26,"%9.2f sec\n",(double)local_148 / 1000000.0);
LAB_0058e629:
  psVar5 = local_118[0];
  if (local_118[0] != (sat_solver *)0x0) {
    if (*(void **)&local_118[0]->qhead != (void *)0x0) {
      free(*(void **)&local_118[0]->qhead);
    }
    free(psVar5);
  }
  psVar5 = local_118[1];
  if (local_118[1] != (sat_solver *)0x0) {
    if (*(void **)((long)local_118[1] + 8) != (void *)0x0) {
      free(*(void **)((long)local_118[1] + 8));
    }
    free(psVar5);
  }
  return (Vec_Str_t *)psVar7;
}

Assistant:

Vec_Str_t * Bmc_CollapseOneOld( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    int nVars = Gia_ManCiNum(p);
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat[2]      = { (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0), (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0) };
    sat_solver * pSatClean[2] = { (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0), (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0) };
    Vec_Str_t * vSop[2]   = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vLitsC[2] = { Vec_IntAlloc(nVars), Vec_IntAlloc(nVars) };
    Vec_Int_t * vVars = Vec_IntAlloc( nVars );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars );
    int n, v, iVar, iLit, iCiVarBeg, iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};

    // collect CI variables
    iCiVarBeg = pCnf->nVars - nVars;// - 1;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        iLit = Abc_Var2Lit( 1, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat[n], &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // start with all negative literals
        Vec_IntForEachEntry( vVars, iVar, v )
            Vec_IntPush( vLitsC[n], Abc_Var2Lit(iVar, 1) );
        // add literals to the solver
        status = sat_solver_addclause( pSat[n], &iLit, &iLit + 1 );
        assert( status );
        status = sat_solver_addclause( pSatClean[n], &iLit, &iLit + 1 );
        assert( status );
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            if ( fCanon )
                status = Bmc_ComputeCanonical( pSat[n], vLitsC[n], vCube, nBTLimit );
            else
            {
                sat_solver_clean_polarity( pSat[n], Vec_IntArray(vVars), Vec_IntSize(vVars) );
                status = sat_solver_solve( pSat[n], NULL, NULL, 0, 0, 0, 0 );
            }
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntClear( vLitsC[n] );
            Vec_IntForEachEntry( vVars, iVar, v )
            {
                iLit = Abc_Var2Lit(iVar, !sat_solver_var_value(pSat[n], iVar));
                Vec_IntPush( vLits, iLit );
                Vec_IntPush( vLitsC[n], iLit );
            }
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
            status = Bmc_CollapseExpand( pSatClean[!n], pSat[n], vLits, vNums, vCube, nBTLimit, fCanon, -1 );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
            status = sat_solver_addclause( pSat[n], Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vLitsC[0] );
    Vec_IntFree( vLitsC[1] );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat[0] );
    sat_solver_delete( pSat[1] );
    sat_solver_delete( pSatClean[0] );
    sat_solver_delete( pSatClean[1] );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}